

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  pointer pSVar1;
  ostream *os;
  ostream *poVar2;
  pointer pSVar3;
  Colour colourGuard;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase<Catch::ConsoleReporter>).
                         currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.nullableValue)->name)
  ;
  pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pSVar3 -
                  (long)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
                        super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x50)) {
    lineInfo.file = (char *)((ulong)lineInfo.file & 0xffffffffffffff00);
    Colour::use(Headers);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar3 = pSVar3 + 1, pSVar3 != pSVar1) {
      printHeaderString(this,&pSVar3->name,2);
    }
    Colour::~Colour((Colour *)&lineInfo);
    pSVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lineInfo.file = pSVar3[-1].lineInfo.file;
  lineInfo.line = pSVar3[-1].lineInfo.line;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000002ed1b0 = 0x2d2d2d2d2d2d2d;
    uRam00000000002ed1b7._0_1_ = '-';
    uRam00000000002ed1b7._1_1_ = '-';
    uRam00000000002ed1b7._2_1_ = '-';
    uRam00000000002ed1b7._3_1_ = '-';
    uRam00000000002ed1b7._4_1_ = '-';
    uRam00000000002ed1b7._5_1_ = '-';
    uRam00000000002ed1b7._6_1_ = '-';
    uRam00000000002ed1b7._7_1_ = '-';
    DAT_002ed1a0 = '-';
    DAT_002ed1a0_1._0_1_ = '-';
    DAT_002ed1a0_1._1_1_ = '-';
    DAT_002ed1a0_1._2_1_ = '-';
    DAT_002ed1a0_1._3_1_ = '-';
    DAT_002ed1a0_1._4_1_ = '-';
    DAT_002ed1a0_1._5_1_ = '-';
    DAT_002ed1a0_1._6_1_ = '-';
    uRam00000000002ed1a8 = 0x2d2d2d2d2d2d2d;
    DAT_002ed1af = 0x2d;
    DAT_002ed190 = '-';
    DAT_002ed190_1._0_1_ = '-';
    DAT_002ed190_1._1_1_ = '-';
    DAT_002ed190_1._2_1_ = '-';
    DAT_002ed190_1._3_1_ = '-';
    DAT_002ed190_1._4_1_ = '-';
    DAT_002ed190_1._5_1_ = '-';
    DAT_002ed190_1._6_1_ = '-';
    uRam00000000002ed198._0_1_ = '-';
    uRam00000000002ed198._1_1_ = '-';
    uRam00000000002ed198._2_1_ = '-';
    uRam00000000002ed198._3_1_ = '-';
    uRam00000000002ed198._4_1_ = '-';
    uRam00000000002ed198._5_1_ = '-';
    uRam00000000002ed198._6_1_ = '-';
    uRam00000000002ed198._7_1_ = '-';
    DAT_002ed180 = '-';
    DAT_002ed180_1._0_1_ = '-';
    DAT_002ed180_1._1_1_ = '-';
    DAT_002ed180_1._2_1_ = '-';
    DAT_002ed180_1._3_1_ = '-';
    DAT_002ed180_1._4_1_ = '-';
    DAT_002ed180_1._5_1_ = '-';
    DAT_002ed180_1._6_1_ = '-';
    uRam00000000002ed188._0_1_ = '-';
    uRam00000000002ed188._1_1_ = '-';
    uRam00000000002ed188._2_1_ = '-';
    uRam00000000002ed188._3_1_ = '-';
    uRam00000000002ed188._4_1_ = '-';
    uRam00000000002ed188._5_1_ = '-';
    uRam00000000002ed188._6_1_ = '-';
    uRam00000000002ed188._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000002ed178._0_1_ = '-';
    uRam00000000002ed178._1_1_ = '-';
    uRam00000000002ed178._2_1_ = '-';
    uRam00000000002ed178._3_1_ = '-';
    uRam00000000002ed178._4_1_ = '-';
    uRam00000000002ed178._5_1_ = '-';
    uRam00000000002ed178._6_1_ = '-';
    uRam00000000002ed178._7_1_ = '-';
    DAT_002ed1bf = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar2,'\n');
  colourGuard.m_moved = false;
  Colour::use(FileName);
  os = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  Catch::operator<<(os,&lineInfo);
  std::operator<<((ostream *)os,'\n');
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000002ed250 = 0x2e2e2e2e2e2e2e;
    uRam00000000002ed257._0_1_ = '.';
    uRam00000000002ed257._1_1_ = '.';
    uRam00000000002ed257._2_1_ = '.';
    uRam00000000002ed257._3_1_ = '.';
    uRam00000000002ed257._4_1_ = '.';
    uRam00000000002ed257._5_1_ = '.';
    uRam00000000002ed257._6_1_ = '.';
    uRam00000000002ed257._7_1_ = '.';
    DAT_002ed240 = '.';
    DAT_002ed240_1._0_1_ = '.';
    DAT_002ed240_1._1_1_ = '.';
    DAT_002ed240_1._2_1_ = '.';
    DAT_002ed240_1._3_1_ = '.';
    DAT_002ed240_1._4_1_ = '.';
    DAT_002ed240_1._5_1_ = '.';
    DAT_002ed240_1._6_1_ = '.';
    uRam00000000002ed248 = 0x2e2e2e2e2e2e2e;
    DAT_002ed24f = 0x2e;
    DAT_002ed230 = '.';
    DAT_002ed230_1._0_1_ = '.';
    DAT_002ed230_1._1_1_ = '.';
    DAT_002ed230_1._2_1_ = '.';
    DAT_002ed230_1._3_1_ = '.';
    DAT_002ed230_1._4_1_ = '.';
    DAT_002ed230_1._5_1_ = '.';
    DAT_002ed230_1._6_1_ = '.';
    uRam00000000002ed238._0_1_ = '.';
    uRam00000000002ed238._1_1_ = '.';
    uRam00000000002ed238._2_1_ = '.';
    uRam00000000002ed238._3_1_ = '.';
    uRam00000000002ed238._4_1_ = '.';
    uRam00000000002ed238._5_1_ = '.';
    uRam00000000002ed238._6_1_ = '.';
    uRam00000000002ed238._7_1_ = '.';
    DAT_002ed220 = '.';
    DAT_002ed220_1._0_1_ = '.';
    DAT_002ed220_1._1_1_ = '.';
    DAT_002ed220_1._2_1_ = '.';
    DAT_002ed220_1._3_1_ = '.';
    DAT_002ed220_1._4_1_ = '.';
    DAT_002ed220_1._5_1_ = '.';
    DAT_002ed220_1._6_1_ = '.';
    uRam00000000002ed228._0_1_ = '.';
    uRam00000000002ed228._1_1_ = '.';
    uRam00000000002ed228._2_1_ = '.';
    uRam00000000002ed228._3_1_ = '.';
    uRam00000000002ed228._4_1_ = '.';
    uRam00000000002ed228._5_1_ = '.';
    uRam00000000002ed228._6_1_ = '.';
    uRam00000000002ed228._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000002ed218._0_1_ = '.';
    uRam00000000002ed218._1_1_ = '.';
    uRam00000000002ed218._2_1_ = '.';
    uRam00000000002ed218._3_1_ = '.';
    uRam00000000002ed218._4_1_ = '.';
    uRam00000000002ed218._5_1_ = '.';
    uRam00000000002ed218._6_1_ = '.';
    uRam00000000002ed218._7_1_ = '.';
    DAT_002ed25f = 0;
  }
  poVar2 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  poVar2 = std::operator<<(poVar2,'\n');
  std::endl<char,std::char_traits<char>>(poVar2);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printTestCaseAndSectionHeader() {
    assert(!m_sectionStack.empty());
    printOpenHeader(currentTestCaseInfo->name);

    if (m_sectionStack.size() > 1) {
        Colour colourGuard(Colour::Headers);

        auto
            it = m_sectionStack.begin() + 1, // Skip first section (test case)
            itEnd = m_sectionStack.end();
        for (; it != itEnd; ++it)
            printHeaderString(it->name, 2);
    }

    SourceLineInfo lineInfo = m_sectionStack.back().lineInfo;

    stream << getLineOfChars<'-'>() << '\n';
    Colour colourGuard(Colour::FileName);
    stream << lineInfo << '\n';
    stream << getLineOfChars<'.'>() << '\n' << std::endl;
}